

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_progress(nk_context *ctx,nk_size *cur,nk_size max,int is_modifyable)

{
  int iVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  ulong uVar4;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  nk_widget_layout_states nVar8;
  nk_context *pnVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  nk_command_buffer *b;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect bounds;
  undefined8 local_98;
  nk_rect local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5292,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  if (cur == (nk_size *)0x0) {
    __assert_fail("cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5293,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  pnVar2 = ctx->current;
  if (pnVar2 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5294,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  pnVar3 = pnVar2->layout;
  if (pnVar3 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x5295,"int nk_progress(struct nk_context *, nk_size *, nk_size, int)");
  }
  nVar8 = nk_widget(&local_68,ctx);
  if (nVar8 == NK_WIDGET_INVALID) {
    return NK_WIDGET_INVALID;
  }
  if (nVar8 == NK_WIDGET_ROM) {
    pnVar9 = (nk_context *)0x0;
  }
  else {
    pnVar9 = (nk_context *)0x0;
    if ((pnVar3->flags & 0x1000) == 0) {
      pnVar9 = ctx;
    }
  }
  uVar4 = *cur;
  fVar16 = local_68.x;
  fVar17 = local_68.y;
  fVar20 = local_68.w;
  fVar18 = local_68.h;
  fVar23 = (ctx->style).progress.border;
  fVar22 = (ctx->style).progress.padding.x + fVar23;
  fVar23 = fVar23 + (ctx->style).progress.padding.y;
  fVar19 = fVar22 + fVar22;
  fVar21 = fVar23 + fVar23;
  fVar26 = fVar19;
  if (fVar19 <= fVar20) {
    fVar26 = fVar20;
  }
  fVar25 = fVar21;
  if (fVar21 <= fVar18) {
    fVar25 = fVar18;
  }
  fVar24 = (float)max;
  fVar22 = fVar22 + fVar16;
  fVar23 = fVar23 + fVar17;
  fVar26 = fVar26 - fVar19;
  if (uVar4 < max) {
    max = uVar4;
  }
  ctx->last_widget_state = ctx->last_widget_state & 2 | 4;
  local_48 = ZEXT416((uint)fVar23);
  local_58 = ZEXT416((uint)(fVar25 - fVar21));
  if ((is_modifyable == 0) || (pnVar9 == (nk_context *)0x0)) goto LAB_001386f8;
  iVar1 = (pnVar9->input).mouse.buttons[0].down;
  fVar19 = (pnVar9->input).mouse.buttons[0].clicked_pos.x;
  bVar15 = false;
  if ((fVar22 <= fVar19) && (bVar15 = false, fVar19 < fVar22 + fVar26)) {
    fVar19 = (pnVar9->input).mouse.buttons[0].clicked_pos.y;
    bVar15 = iVar1 == 1 && (fVar19 < fVar23 + (fVar25 - fVar21) && fVar23 <= fVar19);
  }
  fVar23 = (pnVar9->input).mouse.pos.x;
  fVar20 = fVar16 + fVar20;
  if ((((fVar16 <= fVar23) && (fVar23 < fVar20)) &&
      (fVar19 = (pnVar9->input).mouse.pos.y, fVar17 <= fVar19)) && (fVar19 < fVar17 + fVar18)) {
    ctx->last_widget_state = 0x12;
  }
  if (bVar15 && iVar1 != 0) {
    fVar23 = fVar23 - fVar22;
    if (fVar23 <= 0.0) {
      fVar23 = 0.0;
    }
    fVar19 = (fVar23 / fVar26) * fVar24;
    fVar23 = 0.0;
    if (0.0 <= fVar19) {
      fVar23 = fVar19;
    }
    fVar23 = (float)(~-(uint)(fVar19 < fVar24) & (uint)fVar24 |
                    (uint)fVar23 & -(uint)(fVar19 < fVar24));
    uVar11 = (ulong)fVar23;
    max = (long)(fVar23 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
    (pnVar9->input).mouse.buttons[0].clicked_pos.x = fVar26 * 0.5 + fVar22;
    *(byte *)&ctx->last_widget_state = (byte)ctx->last_widget_state | 0x22;
  }
  if ((ctx->last_widget_state & 0x10) == 0) {
LAB_0013868e:
    fVar23 = (pnVar9->input).mouse.prev.x;
    if (((fVar23 < fVar16) || (fVar20 <= fVar23)) ||
       ((fVar23 = (pnVar9->input).mouse.prev.y, fVar23 < fVar17 ||
        (uVar12 = 0x40, fVar17 + fVar18 <= fVar23)))) goto LAB_001386f8;
  }
  else {
    fVar23 = (pnVar9->input).mouse.prev.x;
    uVar12 = 8;
    if (((fVar16 <= fVar23) && (fVar23 < fVar20)) &&
       ((fVar23 = (pnVar9->input).mouse.prev.y, fVar17 <= fVar23 && (fVar23 < fVar17 + fVar18))))
    goto LAB_0013868e;
  }
  ctx->last_widget_state = ctx->last_widget_state | uVar12;
LAB_001386f8:
  b = &pnVar2->buffer;
  p_Var5 = (ctx->style).progress.draw_begin;
  if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var5)(b,(nk_handle)(ctx->style).progress.userdata.ptr);
  }
  uVar11 = (ulong)((ctx->last_widget_state & 0x10) * 2);
  bVar15 = (ctx->last_widget_state & 0x20) == 0;
  lVar13 = 0x9f8;
  if (bVar15) {
    lVar13 = uVar11 + 0x9b8;
  }
  fVar26 = ((float)uVar4 / fVar24) * fVar26;
  uVar10 = 0x990;
  if (bVar15) {
    uVar10 = uVar11 | 0x950;
  }
  piVar14 = (int *)((long)&(ctx->input).keyboard.keys[0].down + lVar13);
  if (*(int *)((long)&(ctx->input).keyboard.keys[0].down + uVar10) == 0) {
    rect.w = local_68.w;
    rect.h = local_68.h;
    rect.x = local_68.x;
    rect.y = local_68.y;
    nk_fill_rect(b,rect,(ctx->style).progress.rounding,
                 *(nk_color *)((long)&(ctx->input).keyboard.keys[1].down + uVar10));
    rect_00.w = local_68.w;
    rect_00.h = local_68.h;
    rect_00.x = local_68.x;
    rect_00.y = local_68.y;
    nk_stroke_rect(b,rect_00,(ctx->style).progress.rounding,(ctx->style).progress.border,
                   (ctx->style).progress.border_color);
  }
  else {
    r.w = local_68.w;
    r.h = local_68.h;
    r.x = local_68.x;
    r.y = local_68.y;
    nk_draw_image(b,r,(nk_image *)((long)&(ctx->input).keyboard.keys[1].down + uVar10),
                  (nk_color)0xffffffff);
  }
  uVar7 = local_48._0_4_;
  uVar6 = local_58._0_4_;
  if (*piVar14 == 0) {
    rect_01.y = (float)local_48._0_4_;
    rect_01.x = fVar22;
    rect_01.h = (float)local_58._0_4_;
    rect_01.w = fVar26;
    nk_fill_rect(b,rect_01,(ctx->style).progress.rounding,*(nk_color *)(piVar14 + 2));
    rect_02.h = (float)uVar6;
    rect_02.w = fVar26;
    rect_02.x = fVar22;
    rect_02.y = (float)uVar7;
    nk_stroke_rect(b,rect_02,(ctx->style).progress.rounding,(ctx->style).progress.border,
                   (ctx->style).progress.border_color);
  }
  else {
    r_00.y = (float)local_48._0_4_;
    r_00.x = fVar22;
    r_00.h = (float)local_58._0_4_;
    r_00.w = fVar26;
    nk_draw_image(b,r_00,(nk_image *)(piVar14 + 2),(nk_color)0xffffffff);
  }
  p_Var5 = (ctx->style).progress.draw_end;
  if (p_Var5 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var5)(b,(nk_handle)(ctx->style).progress.userdata.ptr);
  }
  *cur = max;
  return (uint)(max != uVar4);
}

Assistant:

NK_API int
nk_progress(struct nk_context *ctx, nk_size *cur, nk_size max, int is_modifyable)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_input *in;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;
    nk_size old_value;

    NK_ASSERT(ctx);
    NK_ASSERT(cur);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !cur)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;

    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    old_value = *cur;
    *cur = nk_do_progress(&ctx->last_widget_state, &win->buffer, bounds,
            *cur, max, is_modifyable, &style->progress, in);
    return (*cur != old_value);
}